

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

KeyInfo * sqlite3KeyInfoFromExprList(Parse *pParse,ExprList *pList,int iStart,int nExtra)

{
  int iVar1;
  KeyInfo *pKVar2;
  CollSeq *pCVar3;
  ExprList_item *pEVar4;
  long lVar5;
  int N;
  
  iVar1 = pList->nExpr;
  N = iVar1 - iStart;
  pKVar2 = sqlite3KeyInfoAlloc(pParse->db,N,nExtra + 1);
  if (pKVar2 != (KeyInfo *)0x0 && (N != 0 && iStart <= iVar1)) {
    pEVar4 = pList->a + (uint)iStart;
    lVar5 = 0;
    do {
      pCVar3 = sqlite3ExprCollSeq(pParse,pEVar4->pExpr);
      if (pCVar3 == (CollSeq *)0x0) {
        pCVar3 = pParse->db->pDfltColl;
      }
      pKVar2->aColl[lVar5] = pCVar3;
      pKVar2->aSortOrder[lVar5] = pEVar4->sortOrder;
      pEVar4 = pEVar4 + 1;
      lVar5 = lVar5 + 1;
    } while (N != (int)lVar5);
  }
  return pKVar2;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoFromExprList(
  Parse *pParse,       /* Parsing context */
  ExprList *pList,     /* Form the KeyInfo object from this ExprList */
  int iStart,          /* Begin with this column of pList */
  int nExtra           /* Add this many extra columns to the end */
){
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3KeyInfoAlloc(db, nExpr-iStart, nExtra+1);
  if( pInfo ){
    assert( sqlite3KeyInfoIsWriteable(pInfo) );
    for(i=iStart, pItem=pList->a+iStart; i<nExpr; i++, pItem++){
      pInfo->aColl[i-iStart] = sqlite3ExprNNCollSeq(pParse, pItem->pExpr);
      pInfo->aSortOrder[i-iStart] = pItem->sortOrder;
    }
  }
  return pInfo;
}